

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O2

void __thiscall w3Interp::f64_Convert_i32u(w3Interp *this)

{
  uint32_t *puVar1;
  
  puVar1 = w3Stack::u32(&this->super_w3Stack);
  w3Stack::set_f64(&this->super_w3Stack,(double)*puVar1);
  return;
}

Assistant:

INTERP (f64_Convert_i32u)
{
    set_f64 ((double)u32 ());
}